

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

void __thiscall ObjLoader::ObjLoader(ObjLoader *this,string *filename)

{
  bool bVar1;
  mapped_type *pmVar2;
  string absolutepath;
  allocator<char> local_81 [17];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->m_rootDir)._M_dataplus._M_p = (pointer)&(this->m_rootDir).field_2;
  (this->m_rootDir)._M_string_length = 0;
  (this->m_rootDir).field_2._M_local_buf[0] = '\0';
  memset(&this->m_vertexPositions,0,0x90);
  (this->m_images).m_images._M_h._M_buckets = &(this->m_images).m_images._M_h._M_single_bucket;
  (this->m_images).m_images._M_h._M_bucket_count = 1;
  (this->m_images).m_images._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_images).m_images._M_h._M_element_count = 0;
  (this->m_images).m_images._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_images).m_images._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_images).m_images._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_materials).super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_materials).super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_materials).super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  absolutename(&local_70,filename);
  basename((char *)&local_50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_rootDir,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->m_images,&defaultDiffuseName_abi_cxx11_);
  pmVar2->width = 1;
  pmVar2->height = 1;
  pmVar2->depth = 1;
  pmVar2->channels = 4;
  pmVar2->data = white;
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->m_images,&defaultNormalName_abi_cxx11_);
  pmVar2->width = 1;
  pmVar2->height = 1;
  pmVar2->depth = 1;
  pmVar2->channels = 4;
  pmVar2->data = bluish;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,".glitter",local_81);
  bVar1 = endsWith(&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    loadBinaryFile(this,&local_70);
  }
  else {
    parseFile(this,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

ObjLoader::ObjLoader(const std::string & filename)
{
  std::string absolutepath = absolutename(filename);
  m_rootDir = basename(absolutepath);
  m_images.add(defaultDiffuseName, Image<>(white, 1, 1, 4));
  m_images.add(defaultNormalName, Image<>(bluish, 1, 1, 4));
  if (endsWith(absolutepath, ".glitter")) {
    loadBinaryFile(absolutepath);
  } else {
    parseFile(absolutepath);
  }
}